

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgExoticQuadrature.hpp
# Opt level: O0

double TasGrid::lagrange_eval(size_t idx,vector<double,_std::allocator<double>_> *roots,double x)

{
  double dVar1;
  double dVar2;
  const_reference pvVar3;
  size_type sVar4;
  undefined8 local_38;
  size_t i_1;
  size_t i;
  double eval_value;
  double x_local;
  vector<double,_std::allocator<double>_> *roots_local;
  size_t idx_local;
  
  i = 0x3ff0000000000000;
  for (i_1 = 0; i_1 < idx; i_1 = i_1 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](roots,i_1);
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](roots,idx);
    dVar2 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](roots,i_1);
    i = (size_t)(((x - dVar1) / (dVar2 - *pvVar3)) * (double)i);
  }
  local_38 = idx + 1;
  while( true ) {
    sVar4 = std::vector<double,_std::allocator<double>_>::size(roots);
    if (sVar4 <= local_38) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](roots,local_38);
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](roots,idx);
    dVar2 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](roots,local_38);
    i = (size_t)(((x - dVar1) / (dVar2 - *pvVar3)) * (double)i);
    local_38 = local_38 + 1;
  }
  return (double)i;
}

Assistant:

inline double lagrange_eval(size_t idx, const std::vector<double> &roots, double x) {
    double eval_value = 1.0;
    for (size_t i=0; i<idx; i++) {
        eval_value *= (x - roots[i]) / (roots[idx] - roots[i]);
    }
    for (size_t i=idx+1; i<roots.size(); i++) {
        eval_value *= (x - roots[i]) / (roots[idx] - roots[i]);
    }
    return eval_value;
}